

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_GetEditionFeatureSetDefaults_Test::
~FeatureResolverTest_GetEditionFeatureSetDefaults_Test
          (FeatureResolverTest_GetEditionFeatureSetDefaults_Test *this)

{
  FeatureResolverTest_GetEditionFeatureSetDefaults_Test *this_local;
  
  ~FeatureResolverTest_GetEditionFeatureSetDefaults_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FeatureResolverTest, GetEditionFeatureSetDefaults) {
  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(FeatureSet::descriptor(),
                                       {GetExtension(pb::test)}, EDITION_LEGACY,
                                       EDITION_99997_TEST_ONLY);

  absl::StatusOr<FeatureSet> edition_2023_feature =
      internal::GetEditionFeatureSetDefaults(EDITION_2023, *defaults);
  absl::StatusOr<FeatureSet> edition_proto3_feature =
      internal::GetEditionFeatureSetDefaults(EDITION_PROTO3, *defaults);
  absl::StatusOr<FeatureSet> edition_proto2_feature =
      internal::GetEditionFeatureSetDefaults(EDITION_LEGACY, *defaults);
  absl::StatusOr<FeatureSet> edition_test_feature =
      internal::GetEditionFeatureSetDefaults(EDITION_99998_TEST_ONLY,
                                             *defaults);
  EXPECT_OK(edition_2023_feature);
  EXPECT_EQ(edition_2023_feature->GetExtension(pb::test).file_feature(),
            pb::VALUE3);
  EXPECT_OK(edition_proto3_feature);
  EXPECT_EQ(edition_proto3_feature->GetExtension(pb::test).file_feature(),
            pb::VALUE2);
  EXPECT_OK(edition_proto2_feature);
  EXPECT_EQ(edition_proto2_feature->GetExtension(pb::test).file_feature(),
            pb::VALUE1);
  EXPECT_OK(edition_test_feature);
  EXPECT_EQ(edition_test_feature->GetExtension(pb::test).file_feature(),
            pb::VALUE4);
}